

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void __thiscall clickhouse::BufferedOutput::DoWrite(BufferedOutput *this,void *data,size_t len)

{
  void *pvVar1;
  size_type sVar2;
  void *in_RDX;
  OutputStream *in_RDI;
  void *in_stack_ffffffffffffffd8;
  
  pvVar1 = (void *)ArrayOutput::Avail((ArrayOutput *)(in_RDI + 5));
  if (pvVar1 < in_RDX) {
    OutputStream::Flush((OutputStream *)0x1e73d7);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 2));
    in_stack_ffffffffffffffd8 = in_RDX;
    if ((void *)(sVar2 >> 1) < in_RDX) {
      OutputStream::Write(in_RDI,in_RDX,0x1e7415);
      return;
    }
  }
  OutputStream::Write(in_RDI,in_stack_ffffffffffffffd8,0x1e7431);
  return;
}

Assistant:

void BufferedOutput::DoWrite(const void* data, size_t len) {
    if (array_output_.Avail() < len) {
        Flush();

        if (len > buffer_.size() / 2) {
            slave_->Write(data, len);
            return;
        }
    }

    array_output_.Write(data, len);
}